

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void Cmd_cd_play(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  char musname [16];
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    builtin_strncpy(musname,",CD,",5);
  }
  else {
    __nptr = FCommandLine::operator[](argv,1);
    atoi(__nptr);
    mysnprintf(musname,0x10,",CD,%d");
  }
  S_ChangeMusic(musname,0,true,false);
  return;
}

Assistant:

CCMD (cd_play)
{
	char musname[16];

	if (argv.argc() == 1)
	{
		strcpy (musname, ",CD,");
	}
	else
	{
		mysnprintf (musname, countof(musname), ",CD,%d", atoi(argv[1]));
	}
	S_ChangeMusic (musname, 0, true);
}